

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _d,int _c,size_t _elemsize,Allocator *_allocator)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 extraout_var;
  void *pvVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(this->dims == 4);
  auVar6._4_4_ = -(uint)(_w == this->w);
  auVar6._8_4_ = -(uint)(_h == this->h);
  auVar6._12_4_ = -(uint)(_d == this->d);
  iVar1 = movmskps(4,auVar6);
  if ((((iVar1 != 0xf) || (this->c != _c)) || (this->elempack != 1)) ||
     ((this->allocator != _allocator || (this->elemsize != _elemsize)))) {
    release(this);
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 4;
    this->w = _w;
    this->h = _h;
    this->d = _d;
    this->c = _c;
    uVar2 = (long)_d * _elemsize * (long)_h * (long)_w + 0xf & 0xfffffffffffffff0;
    uVar3 = uVar2 / _elemsize;
    this->cstep = uVar3;
    lVar5 = (long)_c * uVar3;
    if (lVar5 != 0) {
      uVar3 = lVar5 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar4 = fastMalloc(uVar3 + 4);
      }
      else {
        iVar1 = (*_allocator->_vptr_Allocator[2])(_allocator,uVar3 + 4,uVar2 % _elemsize);
        pvVar4 = (void *)CONCAT44(extraout_var,iVar1);
      }
      this->data = pvVar4;
      this->refcount = (int *)((long)pvVar4 + uVar3);
      *(undefined4 *)((long)pvVar4 + uVar3) = 1;
    }
  }
  return;
}

Assistant:

void Mat::create(int _w, int _h, int _d, int _c, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 4 && w == _w && h == _h && d == _d && c == _c && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 4;
    w = _w;
    h = _h;
    d = _d;
    c = _c;

    cstep = alignSize((size_t)w * h * d * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}